

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

void __thiscall enact::AstSerialise::visitIfExpr_abi_cxx11_(AstSerialise *this)

{
  IfExpr *in_RDX;
  long in_RSI;
  
  visitIfExpr_abi_cxx11_((string *)this,(AstSerialise *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

std::string AstSerialise::visitIfExpr(IfExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::If " << visitExpr(*expr.condition) << '\n';
        m_ident += "    ";

        s << visitExpr(*expr.thenBody) << '\n';
        s << visitExpr(*expr.elseBody) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }